

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandTestRPO(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int local_40;
  uint local_3c;
  int nThreshold;
  int fVerbose;
  int nVarNum;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nThreshold = -1;
  local_3c = 0;
  local_40 = -1;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"TNvh");
      if (iVar1 == -1) {
        if (argc == globalUtilOptind + 1) {
          Abc_RpoTest(argv[globalUtilOptind],nThreshold,local_40,local_3c);
          return 0;
        }
        Abc_Print(1,"Input file is not given.\n");
        goto LAB_0026cb09;
      }
      if (iVar1 == 0x4e) break;
      if (iVar1 == 0x54) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
          goto LAB_0026cb09;
        }
        local_40 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (local_40 < 0) goto LAB_0026cb09;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0026cb09;
        local_3c = local_3c ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      break;
    }
    nThreshold = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < nThreshold);
LAB_0026cb09:
  Abc_Print(-2,"usage: testrpo [-NT <num>] [-vh] <file>\n");
  Abc_Print(-2,"\t           RPO algorithm developed and implemented by Mayler G. A. Martins,\n");
  Abc_Print(-2,"\t           Vinicius Callegaro, Renato P. Ribas and Andre\' I. Reis\n");
  Abc_Print(-2,"\t           at Federal University of Rio Grande do Sul, Porto Alegre, Brazil\n");
  Abc_Print(-2,
            "\t-N <num> : the number of support variables (binary files only) [default = unused]\n")
  ;
  Abc_Print(-2,"\t-T <num> : the number of recursions accepted before abort [default = INFINITE]\n")
  ;
  pcVar2 = "no";
  if (local_3c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  Abc_Print(-2,"\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n");
  Abc_Print(-2,"\t           or a binary file with an array of truth tables (in this case,\n");
  Abc_Print(-2,"\t           -N <num> is required to determine how many functions are stored)\n");
  return 1;
}

Assistant:

int Abc_CommandTestRPO(Abc_Frame_t * pAbc, int argc, char ** argv) {
    extern int Abc_RpoTest(char * pFileName, int nVarNum, int nThreshold, int fVerbose);
    char * pFileName;
    int c;
    int nVarNum = -1;
    int fVerbose = 0;
    int nThreshold = -1;
    Extra_UtilGetoptReset();
    while ((c = Extra_UtilGetopt(argc, argv, "TNvh")) != EOF) {
        switch (c) {
            case 'N':
                if (globalUtilOptind >= argc) {
                    Abc_Print(-1, "Command line switch \"-N\" should be followed by an integer.\n");
                    goto usage;
                }
                nVarNum = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if (nVarNum < 0)
                    goto usage;
                break;
            case 'T':
                if (globalUtilOptind >= argc) {
                    Abc_Print(-1, "Command line switch \"-T\" should be followed by an integer.\n");
                    goto usage;
                }
                nThreshold = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if (nThreshold < 0)
                    goto usage;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if (argc != globalUtilOptind + 1)
    {
        Abc_Print(1, "Input file is not given.\n");
        goto usage;
    }
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the testbench
    Abc_RpoTest( pFileName, nVarNum, nThreshold, fVerbose );
    return 0;

usage:
    Abc_Print(-2, "usage: testrpo [-NT <num>] [-vh] <file>\n");
    Abc_Print(-2, "\t           RPO algorithm developed and implemented by Mayler G. A. Martins,\n");
    Abc_Print(-2, "\t           Vinicius Callegaro, Renato P. Ribas and Andre' I. Reis\n");
    Abc_Print(-2, "\t           at Federal University of Rio Grande do Sul, Porto Alegre, Brazil\n");
    Abc_Print(-2, "\t-N <num> : the number of support variables (binary files only) [default = unused]\n");
    Abc_Print(-2, "\t-T <num> : the number of recursions accepted before abort [default = INFINITE]\n");
    Abc_Print(-2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no");
    Abc_Print(-2, "\t-h       : print the command usage\n");
    Abc_Print(-2, "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n");
    Abc_Print(-2, "\t           or a binary file with an array of truth tables (in this case,\n");
    Abc_Print(-2, "\t           -N <num> is required to determine how many functions are stored)\n");
    return 1;
}